

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_urlglob.c
# Opt level: O0

CURLcode glob_parse(URLGlob *glob,char *pattern,size_t pos,curl_off_t *amount)

{
  char cVar1;
  long lVar2;
  int globindex_00;
  _Bool _Var3;
  bool bVar4;
  size_t local_50;
  size_t skip;
  size_t sublen;
  char *buf;
  int globindex;
  CURLcode res;
  curl_off_t *amount_local;
  size_t pos_local;
  char *pattern_local;
  URLGlob *glob_local;
  
  buf._4_4_ = CURLE_OK;
  buf._0_4_ = 0;
  *amount = 1;
  _globindex = amount;
  amount_local = (curl_off_t *)pos;
  pos_local = (size_t)pattern;
  pattern_local = (char *)glob;
  do {
    if (*(char *)pos_local == '\0' || buf._4_4_ != CURLE_OK) {
      return buf._4_4_;
    }
    skip = 0;
    sublen = *(size_t *)(pattern_local + 0x12d0);
    while( true ) {
      bVar4 = false;
      if (*(char *)pos_local != '\0') {
        bVar4 = *(char *)pos_local != '{';
      }
      if (!bVar4) break;
      if (*(char *)pos_local == '[') {
        local_50 = 0;
        _Var3 = peek_ipv6((char *)pos_local,&local_50);
        if ((!_Var3) && (*(char *)(pos_local + 1) == ']')) {
          local_50 = 2;
        }
        if (local_50 == 0) break;
        memcpy((void *)sublen,(void *)pos_local,local_50);
        skip = local_50 + skip;
        sublen = local_50 + sublen;
        pos_local = local_50 + pos_local;
      }
      else {
        if ((*(char *)pos_local == '}') || (*(char *)pos_local == ']')) {
          *(char **)(pattern_local + 0x12e0) = "unmatched close brace/bracket";
          *(curl_off_t **)(pattern_local + 0x12e8) = amount_local;
          return CURLE_URL_MALFORMAT;
        }
        if ((*(char *)pos_local == '\\') &&
           ((((*(char *)(pos_local + 1) == '{' || (*(char *)(pos_local + 1) == '[')) ||
             (*(char *)(pos_local + 1) == '}')) || (*(char *)(pos_local + 1) == ']')))) {
          pos_local = pos_local + 1;
          amount_local = (curl_off_t *)((long)amount_local + 1);
        }
        *(undefined1 *)sublen = *(undefined1 *)pos_local;
        amount_local = (curl_off_t *)((long)amount_local + 1);
        skip = skip + 1;
        sublen = sublen + 1;
        pos_local = pos_local + 1;
      }
    }
    globindex_00 = (int)buf;
    if (skip == 0) {
      cVar1 = *(char *)pos_local;
      if (cVar1 != '\0') {
        if (cVar1 == '[') {
          pos_local = pos_local + 1;
          amount_local = (curl_off_t *)((long)amount_local + 1);
          buf._0_4_ = (int)buf + 1;
          buf._4_4_ = glob_range((URLGlob *)pattern_local,(char **)&pos_local,
                                 (size_t *)&amount_local,_globindex,globindex_00);
        }
        else if (cVar1 == '{') {
          pos_local = pos_local + 1;
          amount_local = (curl_off_t *)((long)amount_local + 1);
          buf._0_4_ = (int)buf + 1;
          buf._4_4_ = glob_set((URLGlob *)pattern_local,(char **)&pos_local,(size_t *)&amount_local,
                               _globindex,globindex_00);
        }
      }
    }
    else {
      *(undefined1 *)sublen = 0;
      buf._4_4_ = glob_fixed((URLGlob *)pattern_local,*(char **)(pattern_local + 0x12d0),skip);
    }
    lVar2 = *(long *)(pattern_local + 0x12c0);
    *(ulong *)(pattern_local + 0x12c0) = lVar2 + 1U;
    if (99 < lVar2 + 1U) {
      *(char **)(pattern_local + 0x12e0) = "too many globs";
      *(curl_off_t **)(pattern_local + 0x12e8) = amount_local;
      return CURLE_URL_MALFORMAT;
    }
  } while( true );
}

Assistant:

static CURLcode glob_parse(struct URLGlob *glob, char *pattern,
                           size_t pos, curl_off_t *amount)
{
  /* processes a literal string component of a URL
     special characters '{' and '[' branch to set/range processing functions
   */
  CURLcode res = CURLE_OK;
  int globindex = 0; /* count "actual" globs */

  *amount = 1;

  while(*pattern && !res) {
    char *buf = glob->glob_buffer;
    size_t sublen = 0;
    while(*pattern && *pattern != '{') {
      if(*pattern == '[') {
        /* skip over IPv6 literals and [] */
        size_t skip = 0;
        if(!peek_ipv6(pattern, &skip) && (pattern[1] == ']'))
          skip = 2;
        if(skip) {
          memcpy(buf, pattern, skip);
          buf += skip;
          pattern += skip;
          sublen += skip;
          continue;
        }
        break;
      }
      if(*pattern == '}' || *pattern == ']')
        return GLOBERROR("unmatched close brace/bracket", pos,
                         CURLE_URL_MALFORMAT);

      /* only allow \ to escape known "special letters" */
      if(*pattern == '\\' &&
         (*(pattern + 1) == '{' || *(pattern + 1) == '[' ||
          *(pattern + 1) == '}' || *(pattern + 1) == ']') ) {

        /* escape character, skip '\' */
        ++pattern;
        ++pos;
      }
      *buf++ = *pattern++; /* copy character to literal */
      ++pos;
      sublen++;
    }
    if(sublen) {
      /* we got a literal string, add it as a single-item list */
      *buf = '\0';
      res = glob_fixed(glob, glob->glob_buffer, sublen);
    }
    else {
      switch(*pattern) {
      case '\0': /* done  */
        break;

      case '{':
        /* process set pattern */
        pattern++;
        pos++;
        res = glob_set(glob, &pattern, &pos, amount, globindex++);
        break;

      case '[':
        /* process range pattern */
        pattern++;
        pos++;
        res = glob_range(glob, &pattern, &pos, amount, globindex++);
        break;
      }
    }

    if(++glob->size >= GLOB_PATTERN_NUM)
      return GLOBERROR("too many globs", pos, CURLE_URL_MALFORMAT);
  }
  return res;
}